

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestRegistry::registerTest(TestRegistry *this,TestCase *testCase)

{
  bool bVar1;
  TestCaseInfo *__str;
  ReusableStringStream *this_00;
  string local_138;
  TestCase local_118;
  undefined1 local_50 [8];
  ReusableStringStream rss;
  string name;
  TestCase *testCase_local;
  TestRegistry *this_local;
  
  __str = TestCase::getTestCaseInfo(testCase);
  std::__cxx11::string::string((string *)&rss.m_oss,&__str->name);
  bVar1 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rss.m_oss);
  if (bVar1) {
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_50);
    this_00 = ReusableStringStream::operator<<
                        ((ReusableStringStream *)local_50,(char (*) [21])"Anonymous test case ");
    this->m_unnamedCount = this->m_unnamedCount + 1;
    ReusableStringStream::operator<<(this_00,&this->m_unnamedCount);
    ReusableStringStream::str_abi_cxx11_(&local_138,(ReusableStringStream *)local_50);
    TestCase::withName(&local_118,testCase,&local_138);
    (*(this->super_ITestCaseRegistry)._vptr_ITestCaseRegistry[4])(this,&local_118);
    TestCase::~TestCase(&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_50);
  }
  else {
    clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
              (&this->m_functions,testCase);
  }
  std::__cxx11::string::~string((string *)&rss.m_oss);
  return;
}

Assistant:

void TestRegistry::registerTest( TestCase const& testCase ) {
        std::string name = testCase.getTestCaseInfo().name;
        if( name.empty() ) {
            ReusableStringStream rss;
            rss << "Anonymous test case " << ++m_unnamedCount;
            return registerTest( testCase.withName( rss.str() ) );
        }
        m_functions.push_back( testCase );
    }